

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall
FileTokenizer::createTokenCurrentString(FileTokenizer *this,TokenType type,size_t length)

{
  size_t sVar1;
  size_type sVar2;
  size_type sVar3;
  string *originalText;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  string valueStr;
  string originalStr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (this->token).type = type;
  sVar1 = this->linePos;
  (this->token).line = this->lineNumber;
  (this->token).column = sVar1 + 1;
  std::__cxx11::string::substr((ulong)&local_110,(ulong)&this->currentLine);
  std::__cxx11::string::substr((ulong)&local_f0,(ulong)&this->currentLine);
  sVar3 = local_e8;
  sVar2 = local_108;
  if ((type & ~Assign) == Identifier) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    if (local_110 == &local_100) {
      local_90.field_2._8_8_ = local_100._8_8_;
    }
    else {
      local_90._M_dataplus._M_p = (pointer)local_110;
    }
    local_90._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    originalText = &local_50;
    local_110 = &local_100;
    Identifier::Identifier((Identifier *)originalText,&local_90);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    if (local_f0 == &local_e0) {
      local_70.field_2._8_8_ = local_e0._8_8_;
    }
    else {
      local_70._M_dataplus._M_p = (pointer)local_f0;
    }
    local_70._M_string_length = local_e8;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_f0 = &local_e0;
    Token::setValue<Identifier>(&this->token,(Identifier *)originalText,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    value = &local_90;
  }
  else {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    if (local_110 == &local_100) {
      local_d0.field_2._8_8_ = local_100._8_8_;
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)local_110;
    }
    local_108 = 0;
    local_d0._M_string_length = sVar2;
    local_100._M_local_buf[0] = '\0';
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    if (local_f0 == &local_e0) {
      local_b0.field_2._8_8_ = local_e0._8_8_;
    }
    else {
      local_b0._M_dataplus._M_p = (pointer)local_f0;
    }
    local_e8 = 0;
    originalText = &local_b0;
    local_b0._M_string_length = sVar3;
    local_e0._M_local_buf[0] = '\0';
    value = &local_d0;
    local_110 = &local_100;
    local_f0 = &local_e0;
    Token::setValue<std::__cxx11::string>(&this->token,value,originalText);
  }
  std::__cxx11::string::~string((string *)originalText);
  std::__cxx11::string::~string((string *)value);
  this->linePos = this->linePos + length;
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  return;
}

Assistant:

void FileTokenizer::createTokenCurrentString(TokenType type, size_t length)
{
	token.type = type;
	token.line = lineNumber;
	token.column = linePos+1;

	std::string valueStr = currentLine.substr(linePos, length);
	std::string originalStr = currentLine.substr(linePos, length);
	if (type == TokenType::Identifier || type == TokenType::Equ)
		token.setValue(Identifier(std::move(valueStr)), std::move(originalStr));
	else
		token.setValue(std::move(valueStr), std::move(originalStr));

	linePos += length;
}